

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O0

void __thiscall
MxxColl_AllgathervUnknownSize_Test::MxxColl_AllgathervUnknownSize_Test
          (MxxColl_AllgathervUnknownSize_Test *this)

{
  MxxColl_AllgathervUnknownSize_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__MxxColl_AllgathervUnknownSize_Test_00294488;
  return;
}

Assistant:

TEST(MxxColl, AllgathervUnknownSize) {
    mxx::comm c;
    // fill elements
    size_t size = 5*(c.rank()+2);
    std::vector<int> els(size);
    for (size_t i = 0; i < size; ++i) {
        els[i] = c.rank()*13 - 42*i;
    }
    // calculate expected receive size (only for test verification)
    size_t total_size = 0;
    for (int i = 0; i < c.size(); ++i) {
        total_size += 5*(i+2);
    }

    // gatherv with unknown receive sizes
    std::vector<int> all;
    all = mxx::allgatherv(&els[0], size, c);
    ASSERT_EQ(total_size, all.size());
    size_t pos = 0;
    for (int i = 0; i < c.size(); ++i) {
        for (int j = 0; j < (5*(i+2)); ++j) {
            ASSERT_EQ(i*13 - 42*j, all[pos++]);
        }
    }
    // convenience function (taking vector)
    all = mxx::allgatherv(els);
    ASSERT_EQ(total_size, all.size());
    pos = 0;
    for (int i = 0; i < c.size(); ++i) {
        for (int j = 0; j < (5*(i+2)); ++j) {
            ASSERT_EQ(i*13 - 42*j, all[pos++]);
        }
    }
}